

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::Own<capnp::PipelineHook>_> __thiscall
kj::_::ForkHub<kj::Own<capnp::PipelineHook>_>::addBranch
          (ForkHub<kj::Own<capnp::PipelineHook>_> *this)

{
  PromiseNode *extraout_RDX;
  ForkHub<kj::Own<capnp::PipelineHook>_> *in_RSI;
  Promise<kj::Own<capnp::PipelineHook>_> PVar1;
  Own<kj::_::ForkHub<kj::Own<capnp::PipelineHook>_>_> local_48;
  Own<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>_>_> local_38;
  Own<kj::_::PromiseNode> local_28;
  ForkHub<kj::Own<capnp::PipelineHook>_> *this_local;
  
  this_local = this;
  addRef<kj::_::ForkHub<kj::Own<capnp::PipelineHook>>>((kj *)&local_48,in_RSI);
  heap<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>>,kj::Own<kj::_::ForkHub<kj::Own<capnp::PipelineHook>>>>
            ((kj *)&local_38,&local_48);
  Own<kj::_::PromiseNode>::Own<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>>,void>
            (&local_28,&local_38);
  Promise<kj::Own<capnp::PipelineHook>_>::Promise
            ((Promise<kj::Own<capnp::PipelineHook>_> *)this,false,&local_28);
  Own<kj::_::PromiseNode>::~Own(&local_28);
  Own<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>_>_>::~Own(&local_38);
  Own<kj::_::ForkHub<kj::Own<capnp::PipelineHook>_>_>::~Own(&local_48);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<capnp::PipelineHook>_>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<_::UnfixVoid<T>> addBranch() {
    return Promise<_::UnfixVoid<T>>(false, kj::heap<ForkBranch<T>>(addRef(*this)));
  }